

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

POMDPXState * __thiscall
despot::MemoryPool<despot::POMDPXState>::Allocate(MemoryPool<despot::POMDPXState> *this)

{
  value_type pPVar1;
  bool bVar2;
  reference ppPVar3;
  POMDPXState *obj;
  MemoryPool<despot::POMDPXState> *this_local;
  
  bVar2 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::empty
                    (&this->freelist_);
  if (bVar2) {
    NewChunk(this);
  }
  ppPVar3 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::back
                      (&this->freelist_);
  pPVar1 = *ppPVar3;
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::pop_back
            (&this->freelist_);
  bVar2 = MemoryObject::IsAllocated(&(pPVar1->super_State).super_MemoryObject);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    MemoryObject::SetAllocated(&(pPVar1->super_State).super_MemoryObject);
    this->num_allocated_ = this->num_allocated_ + 1;
    return pPVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::POMDPXState>::Allocate() [T = despot::POMDPXState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}